

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSettingsInstallHandler(ImGuiContext *context)

{
  int iVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiID IVar3;
  ImGuiSettingsHandler *__dest;
  int iVar4;
  int iVar5;
  
  IVar3 = ImHashStr("Table",0,0);
  iVar5 = (context->SettingsHandlers).Size;
  iVar1 = (context->SettingsHandlers).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      __dest = (ImGuiSettingsHandler *)MemAlloc((long)iVar5 * 0x48);
      pIVar2 = (context->SettingsHandlers).Data;
      if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar2,(long)(context->SettingsHandlers).Size * 0x48);
        MemFree((context->SettingsHandlers).Data);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar5;
    }
  }
  pIVar2 = (context->SettingsHandlers).Data;
  iVar5 = (context->SettingsHandlers).Size;
  pIVar2[iVar5].TypeName = "Table";
  pIVar2[iVar5].TypeHash = IVar3;
  *(undefined4 *)&pIVar2[iVar5].field_0xc = 0;
  pIVar2[iVar5].ClearAllFn = TableSettingsHandler_ClearAll;
  pIVar2[iVar5].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  pIVar2[iVar5].ReadOpenFn = TableSettingsHandler_ReadOpen;
  pIVar2[iVar5].ReadLineFn = TableSettingsHandler_ReadLine;
  pIVar2[iVar5].ApplyAllFn = TableSettingsHandler_ApplyAll;
  pIVar2[iVar5].WriteAllFn = TableSettingsHandler_WriteAll;
  pIVar2[iVar5].UserData = (void *)0x0;
  (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::TableSettingsInstallHandler(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}